

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

char * __thiscall Fl_Help_View::get_attr(Fl_Help_View *this,char *p,char *n,char *buf,int bufsize)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  char name [255];
  byte local_138 [264];
  
  *buf = '\0';
  do {
    pbVar4 = local_138;
    if (*p == 0) {
      return (char *)0x0;
    }
    if (*p == 0x3e) {
      return (char *)0x0;
    }
    p = (char *)((byte *)p + -1);
    do {
      bVar5 = ((byte *)p)[1];
      p = (char *)((byte *)p + 1);
      iVar3 = isspace((uint)bVar5);
    } while (iVar3 != 0);
    if (bVar5 == 0) {
      return (char *)0x0;
    }
    if (bVar5 == 0x3e) {
      return (char *)0x0;
    }
    bVar5 = *p;
    if (bVar5 != 0) {
      lVar6 = 0;
      do {
        iVar3 = isspace((uint)bVar5);
        if (((byte)(bVar5 - 0x3d) < 2) || (iVar3 != 0)) break;
        if (lVar6 < 0xfe) {
          lVar6 = lVar6 + 1;
          *pbVar4 = bVar5;
        }
        pbVar4 = local_138 + lVar6;
        bVar5 = ((byte *)p)[1];
        p = (char *)((byte *)p + 1);
      } while (bVar5 != 0);
    }
    *pbVar4 = 0;
    bVar5 = *p;
    iVar3 = isspace((uint)bVar5);
    pbVar4 = (byte *)buf;
    if (((iVar3 == 0) && (bVar5 != 0)) && (bVar5 != 0x3e)) {
      pbVar7 = (byte *)p + (bVar5 == 0x3d);
      bVar5 = ((byte *)p)[bVar5 == 0x3d];
      while (p = (char *)pbVar7, bVar5 != 0) {
        iVar3 = isspace((uint)bVar5);
        if ((bVar5 == 0x3e) || (iVar3 != 0)) break;
        if ((bVar5 == 0x27) || (bVar5 == 0x22)) {
          bVar1 = pbVar7[1];
          while( true ) {
            pbVar2 = pbVar7 + 1;
            if ((bVar1 == 0) || (bVar1 == bVar5)) break;
            if ((long)(pbVar4 + (1 - (long)buf)) < (long)bufsize) {
              *pbVar4 = bVar1;
              pbVar4 = pbVar4 + 1;
            }
            bVar1 = pbVar2[1];
            pbVar7 = pbVar2;
          }
          pbVar7 = pbVar7 + 2;
          if (bVar1 != bVar5) {
            pbVar7 = pbVar2;
          }
        }
        else {
          pbVar7 = pbVar7 + 1;
          if ((long)(pbVar4 + (1 - (long)buf)) < (long)bufsize) {
            *pbVar4 = bVar5;
            pbVar4 = pbVar4 + 1;
          }
        }
        bVar5 = *pbVar7;
      }
    }
    *pbVar4 = 0;
    iVar3 = strcasecmp(n,(char *)local_138);
    if (iVar3 == 0) {
      return buf;
    }
    *buf = '\0';
    if (*p == 0x3e) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char *					// O - Pointer to buf or NULL
Fl_Help_View::get_attr(const char *p,		// I - Pointer to start of attributes
                      const char *n,		// I - Name of attribute
		      char       *buf,		// O - Buffer for attribute value
		      int        bufsize)	// I - Size of buffer
{
  char	name[255],				// Name from string
	*ptr,					// Pointer into name or value
	quote;					// Quote


  buf[0] = '\0';

  while (*p && *p != '>')
  {
    while (isspace((*p)&255))
      p ++;

    if (*p == '>' || !*p)
      return (NULL);

    for (ptr = name; *p && !isspace((*p)&255) && *p != '=' && *p != '>';)
      if (ptr < (name + sizeof(name) - 1))
        *ptr++ = *p++;
      else
        p ++;

    *ptr = '\0';

    if (isspace((*p)&255) || !*p || *p == '>')
      buf[0] = '\0';
    else
    {
      if (*p == '=')
        p ++;

      for (ptr = buf; *p && !isspace((*p)&255) && *p != '>';)
        if (*p == '\'' || *p == '\"')
	{
	  quote = *p++;

	  while (*p && *p != quote)
	    if ((ptr - buf + 1) < bufsize)
	      *ptr++ = *p++;
	    else
	      p ++;

          if (*p == quote)
	    p ++;
	}
	else if ((ptr - buf + 1) < bufsize)
	  *ptr++ = *p++;
	else
	  p ++;

      *ptr = '\0';
    }

    if (strcasecmp(n, name) == 0)
      return (buf);
    else
      buf[0] = '\0';

    if (*p == '>')
      return (NULL);
  }

  return (NULL);
}